

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void P_TraceBleed(int damage,FTranslatedLineTarget *t,AActor *puff)

{
  AActor *actor;
  uint uVar1;
  int iVar2;
  bool bVar3;
  TAngle<double> local_58;
  TAngle<double> local_50;
  DVector3 local_48;
  TAngle<double> local_30;
  DAngle pitch;
  AActor *puff_local;
  FTranslatedLineTarget *t_local;
  int damage_local;
  
  bVar3 = true;
  if (t->linetarget != (AActor *)0x0) {
    TFlags<ActorFlag3,_unsigned_int>::operator&
              ((TFlags<ActorFlag3,_unsigned_int> *)((long)&pitch.Degrees + 4),
               (int)puff + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&pitch.Degrees + 4));
    bVar3 = uVar1 != 0;
  }
  if (!bVar3) {
    iVar2 = FRandom::operator()(&pr_tracebleed);
    TAngle<double>::TAngle(&local_30,(double)(iVar2 + -0x80) * 0.0054931640625);
    AActor::PosPlusZ(&local_48,t->linetarget,t->linetarget->Height / 2.0);
    actor = t->linetarget;
    TAngle<double>::TAngle(&local_50,&t->angleFromSource);
    TAngle<double>::TAngle(&local_58,&local_30);
    P_TraceBleed(damage,&local_48,actor,&local_50,&local_58);
  }
  return;
}

Assistant:

void P_TraceBleed(int damage, FTranslatedLineTarget *t, AActor *puff)
{
	if (t->linetarget == NULL || puff->flags3 & MF3_BLOODLESSIMPACT)
	{
		return;
	}

	DAngle pitch = (pr_tracebleed() - 128) * (360 / 65536.);
	P_TraceBleed(damage, t->linetarget->PosPlusZ(t->linetarget->Height/2), t->linetarget, t->angleFromSource, pitch);
}